

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnRethrowExpr
          (BinaryReaderInterp *this,Index depth)

{
  Result RVar1;
  Enum EVar2;
  Index catch_depth;
  Location loc_1;
  Location local_b8;
  Location local_98;
  Var local_70;
  
  local_b8.field_1.field_0.last_column = 0;
  local_b8.filename._M_len = (this->filename_)._M_len;
  local_b8.filename._M_str = (this->filename_)._M_str;
  local_b8.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_98.field_1.field_0.last_column = 0;
  local_98.filename._M_len = (this->filename_)._M_len;
  local_98.filename._M_str = (this->filename_)._M_str;
  local_98.field_1.field_1.offset = local_b8.field_1.field_1.offset;
  Var::Var(&local_70,depth,&local_98);
  RVar1 = SharedValidator::OnRethrow(&this->validator_,&local_b8,&local_70);
  Var::~Var(&local_70);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    RVar1 = TypeChecker::GetCatchCount(&(this->validator_).typechecker_,depth,(Index *)&local_b8);
    if (RVar1.enum_ != Error) {
      Istream::Emit(this->istream_,Rethrow,(int)local_b8.filename._M_len - 1);
      EVar2 = Ok;
    }
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderInterp::OnRethrowExpr(Index depth) {
  Index catch_depth;
  CHECK_RESULT(validator_.OnRethrow(GetLocation(), Var(depth, GetLocation())));
  CHECK_RESULT(validator_.GetCatchCount(depth, &catch_depth));
  // The rethrow opcode takes an index into the exception stack rather than
  // the number of catch nestings, so we subtract one here.
  istream_.Emit(Opcode::Rethrow, catch_depth - 1);
  return Result::Ok;
}